

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlGoUp(NodeAVL *nd)

{
  NodeAVL *in_RDI;
  NodeAVL *in_stack_ffffffffffffffe8;
  NodeAVL *local_8;
  
  local_8 = in_RDI;
  if (in_RDI->parent != (NodeAVL *)0x0) {
    in_RDI->parent->tmp = in_RDI;
    local_8 = avlGoUp(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlGoUp( NodeAVL* nd ){
    #ifdef DEBUG_AVL
      printf( "avlGoUp id=%d\n", nd->id );
    #endif
    if ( !nd->parent ) return nd;
    nd->parent->tmp = nd;
    return avlGoUp( nd->parent );
}